

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cc
# Opt level: O0

bool __thiscall
flow::lang::Interpreter::compile
          (Interpreter *this,Parser *parser,Report *report,int optimizationLevel)

{
  uint uVar1;
  pointer program_00;
  pointer this_00;
  TargetCodeGenerator local_640;
  undefined1 local_388 [8];
  unique_ptr<flow::Program,_std::default_delete<flow::Program>_> program;
  allocator<char> local_351;
  string local_350;
  _func_bool_IRHandler_ptr *local_330;
  HandlerPass local_328;
  allocator<char> local_301;
  string local_300;
  _func_bool_IRHandler_ptr *local_2e0;
  HandlerPass local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  _func_bool_IRHandler_ptr *local_290;
  HandlerPass local_288;
  allocator<char> local_261;
  string local_260;
  _func_bool_IRHandler_ptr *local_240;
  HandlerPass local_238;
  allocator<char> local_211;
  string local_210;
  _func_bool_IRHandler_ptr *local_1f0;
  HandlerPass local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  _func_bool_IRHandler_ptr *local_1a0;
  HandlerPass local_198;
  allocator<char> local_171;
  string local_170;
  undefined1 local_150 [8];
  PassManager pm;
  unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> programIR;
  undefined1 local_120 [8];
  IRGenerator irgen;
  undefined1 local_38 [8];
  unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_> unit;
  int optimizationLevel_local;
  Report *report_local;
  Parser *parser_local;
  Interpreter *this_local;
  
  unit._M_t.super___uniq_ptr_impl<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_>.
  _M_t.super__Tuple_impl<0UL,_flow::lang::UnitSym_*,_std::default_delete<flow::lang::UnitSym>_>.
  super__Head_base<0UL,_flow::lang::UnitSym_*,_false>._M_head_impl._4_4_ = optimizationLevel;
  Parser::parse((Parser *)local_38);
  uVar1 = (*report->_vptr_Report[3])();
  if ((uVar1 & 1) == 0) {
    IRGenerator::IRGenerator((IRGenerator *)local_120,report);
    std::unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_>::get
              ((unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_> *)
               local_38);
    IRGenerator::generate
              ((IRGenerator *)
               &pm.handlerPasses_.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                ._M_impl._M_node._M_size,(UnitSym *)local_120);
    if (0 < unit._M_t.
            super___uniq_ptr_impl<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_>.
            _M_t.
            super__Tuple_impl<0UL,_flow::lang::UnitSym_*,_std::default_delete<flow::lang::UnitSym>_>
            .super__Head_base<0UL,_flow::lang::UnitSym_*,_false>._M_head_impl._4_4_) {
      PassManager::PassManager((PassManager *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"eliminate-empty-blocks",&local_171);
      local_1a0 = transform::emptyBlockElimination;
      std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
                ((function<bool(flow::IRHandler*)> *)&local_198,&local_1a0);
      PassManager::registerPass((PassManager *)local_150,&local_170,&local_198);
      std::function<bool_(flow::IRHandler_*)>::~function(&local_198);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      if (0 < unit._M_t.
              super___uniq_ptr_impl<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_>.
              _M_t.
              super__Tuple_impl<0UL,_flow::lang::UnitSym_*,_std::default_delete<flow::lang::UnitSym>_>
              .super__Head_base<0UL,_flow::lang::UnitSym_*,_false>._M_head_impl._4_4_) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"eliminate-linear-br",&local_1c1);
        local_1f0 = transform::eliminateLinearBr;
        std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
                  ((function<bool(flow::IRHandler*)> *)&local_1e8,&local_1f0);
        PassManager::registerPass((PassManager *)local_150,&local_1c0,&local_1e8);
        std::function<bool_(flow::IRHandler_*)>::~function(&local_1e8);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator(&local_1c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"eliminate-unused-blocks",&local_211);
        local_240 = transform::eliminateUnusedBlocks;
        std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
                  ((function<bool(flow::IRHandler*)> *)&local_238,&local_240);
        PassManager::registerPass((PassManager *)local_150,&local_210,&local_238);
        std::function<bool_(flow::IRHandler_*)>::~function(&local_238);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator(&local_211);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"eliminate-unused-instr",&local_261);
        local_290 = transform::eliminateUnusedInstr;
        std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
                  ((function<bool(flow::IRHandler*)> *)&local_288,&local_290);
        PassManager::registerPass((PassManager *)local_150,&local_260,&local_288);
        std::function<bool_(flow::IRHandler_*)>::~function(&local_288);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator(&local_261);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,"fold-constant-condbr",&local_2b1);
        local_2e0 = transform::foldConstantCondBr;
        std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
                  ((function<bool(flow::IRHandler*)> *)&local_2d8,&local_2e0);
        PassManager::registerPass((PassManager *)local_150,&local_2b0,&local_2d8);
        std::function<bool_(flow::IRHandler_*)>::~function(&local_2d8);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator(&local_2b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_300,"rewrite-br-to-exit",&local_301);
        local_330 = transform::rewriteBrToExit;
        std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
                  ((function<bool(flow::IRHandler*)> *)&local_328,&local_330);
        PassManager::registerPass((PassManager *)local_150,&local_300,&local_328);
        std::function<bool_(flow::IRHandler_*)>::~function(&local_328);
        std::__cxx11::string::~string((string *)&local_300);
        std::allocator<char>::~allocator(&local_301);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"rewrite-cond-br-to-same-branches",&local_351);
        program._M_t.super___uniq_ptr_impl<flow::Program,_std::default_delete<flow::Program>_>._M_t.
        super__Tuple_impl<0UL,_flow::Program_*,_std::default_delete<flow::Program>_>.
        super__Head_base<0UL,_flow::Program_*,_false>._M_head_impl =
             (__uniq_ptr_data<flow::Program,_std::default_delete<flow::Program>,_true,_true>)
             transform::rewriteCondBrToSameBranches;
        std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
                  ((function<bool(flow::IRHandler*)> *)&stack0xfffffffffffffc88,
                   (_func_bool_IRHandler_ptr **)&program);
        PassManager::registerPass
                  ((PassManager *)local_150,&local_350,(HandlerPass *)&stack0xfffffffffffffc88);
        std::function<bool_(flow::IRHandler_*)>::~function
                  ((function<bool_(flow::IRHandler_*)> *)&stack0xfffffffffffffc88);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator(&local_351);
      }
      program_00 = std::unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::get
                             ((unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)
                              &pm.handlerPasses_.
                               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                               ._M_impl._M_node._M_size);
      PassManager::run((PassManager *)local_150,program_00);
      PassManager::~PassManager((PassManager *)local_150);
    }
    std::unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::operator=
              (&this->programIR_,
               (unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)
               &pm.handlerPasses_.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                ._M_impl._M_node._M_size);
    TargetCodeGenerator::TargetCodeGenerator(&local_640);
    std::unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::get(&this->programIR_);
    TargetCodeGenerator::generate((TargetCodeGenerator *)local_388,(IRProgram *)&local_640);
    TargetCodeGenerator::~TargetCodeGenerator(&local_640);
    this_00 = std::unique_ptr<flow::Program,_std::default_delete<flow::Program>_>::operator->
                        ((unique_ptr<flow::Program,_std::default_delete<flow::Program>_> *)local_388
                        );
    Program::link(this_00,(char *)this,(char *)report);
    uVar1 = (*report->_vptr_Report[3])();
    this_local._7_1_ = (uVar1 & 1) == 0;
    if (this_local._7_1_) {
      std::unique_ptr<flow::Program,_std::default_delete<flow::Program>_>::operator=
                (&this->program_,
                 (unique_ptr<flow::Program,_std::default_delete<flow::Program>_> *)local_388);
      this->initialized_ = false;
    }
    irgen.report_._4_4_ = 1;
    std::unique_ptr<flow::Program,_std::default_delete<flow::Program>_>::~unique_ptr
              ((unique_ptr<flow::Program,_std::default_delete<flow::Program>_> *)local_388);
    std::unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::~unique_ptr
              ((unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)
               &pm.handlerPasses_.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                ._M_impl._M_node._M_size);
    IRGenerator::~IRGenerator((IRGenerator *)local_120);
  }
  else {
    this_local._7_1_ = false;
    irgen.report_._4_4_ = 1;
  }
  std::unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_>::~unique_ptr
            ((unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_> *)local_38)
  ;
  return this_local._7_1_;
}

Assistant:

bool Interpreter::compile(Parser&& parser,
                          diagnostics::Report* report,
                          int optimizationLevel) {
  std::unique_ptr<flow::lang::UnitSym> unit = parser.parse();

  if (report->containsFailures())
    return false;

  IRGenerator irgen{report};
  std::unique_ptr<IRProgram> programIR = irgen.generate(unit.get());

  if (optimizationLevel > 0) {
    flow::PassManager pm;

    // mandatory passes
    pm.registerPass("eliminate-empty-blocks", &transform::emptyBlockElimination);

    // optional passes
    if (optimizationLevel >= 1) {
      pm.registerPass("eliminate-linear-br", &transform::eliminateLinearBr);
      pm.registerPass("eliminate-unused-blocks", &transform::eliminateUnusedBlocks);
      pm.registerPass("eliminate-unused-instr", &transform::eliminateUnusedInstr);
      pm.registerPass("fold-constant-condbr", &transform::foldConstantCondBr);
      pm.registerPass("rewrite-br-to-exit", &transform::rewriteBrToExit);
      pm.registerPass("rewrite-cond-br-to-same-branches", &transform::rewriteCondBrToSameBranches);
    }

    pm.run(programIR.get());
  }

  programIR_ = std::move(programIR);

  std::unique_ptr<Program> program = TargetCodeGenerator().generate(programIR_.get());
  program->link(this, report);
  if (report->containsFailures())
    return false;

  program_ = std::move(program);
  initialized_ = false;
  return true;
}